

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# color.cc
# Opt level: O0

bool wabt::Color::SupportsColor(FILE *file)

{
  int iVar1;
  char *__nptr;
  char *force;
  FILE *file_local;
  
  __nptr = getenv("FORCE_COLOR");
  if (__nptr == (char *)0x0) {
    iVar1 = fileno((FILE *)file);
    iVar1 = isatty(iVar1);
  }
  else {
    iVar1 = atoi(__nptr);
  }
  file_local._7_1_ = iVar1 != 0;
  return file_local._7_1_;
}

Assistant:

bool Color::SupportsColor(FILE* file) {
  char* force = getenv("FORCE_COLOR");
  if (force) {
    return atoi(force) != 0;
  }

#if HAVE_WIN32_VT100

  HANDLE handle;
  if (file == stdout) {
    handle = GetStdHandle(STD_OUTPUT_HANDLE);
  } else if (file == stderr) {
    handle = GetStdHandle(STD_ERROR_HANDLE);
  } else {
    return false;
  }
  DWORD mode;
  if (!_isatty(_fileno(file)) || !GetConsoleMode(handle, &mode) ||
      !SetConsoleMode(handle, mode | ENABLE_VIRTUAL_TERMINAL_PROCESSING)) {
    return false;
  }
  return true;
  // TODO(binji): Support older Windows by using SetConsoleTextAttribute?

#elif HAVE_UNISTD_H

  return isatty(fileno(file));

#else

  return false;

#endif
}